

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

int check_if_png(char *fileName,FILE **file)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  undefined8 *in_RSI;
  char *in_RDI;
  uchar buf [8];
  undefined1 local_20 [8];
  undefined8 *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  pFVar2 = fopen(in_RDI,"rb");
  *local_18 = pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    local_4 = 0;
  }
  else {
    sVar3 = fread(local_20,1,8,(FILE *)*local_18);
    if (sVar3 == 8) {
      iVar1 = png_sig_cmp(local_20,0,8);
      local_4 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int check_if_png (const char *fileName, FILE **file)
{
	unsigned char buf[8];
	/* Open the alleged PNG file. */
	if ((*file = fopen(fileName, "rb")) == NULL)
		return NOT_PNG;

	/* Read the first eight bytes and compare them to the signature */
	if (fread(buf, 1, 8, *file) != 8)
		return NOT_PNG;
	return !png_sig_cmp(buf, 0, 8);
}